

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getInitialization_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ptVar3;
  TestError *this_00;
  GLuint column;
  GLchar *__s;
  InitializerListTest *pIVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  InitializerListTest *local_58;
  undefined1 local_50 [32];
  
  iVar6 = this->m_current_test_case_index;
  ptVar3 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_58 = this;
  switch(ptVar3[iVar6].m_initializer) {
  case VECTOR:
    getVectorInitializer_abi_cxx11_(&local_80,this,0,ptVar3[iVar6].m_n_rows);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    goto LAB_009f7724;
  case MATRIX:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    getVectorArrayList_abi_cxx11_(&local_80,local_58,ptVar3[iVar6].m_n_cols,ptVar3[iVar6].m_n_rows);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    goto LAB_009f6dcd;
  case MATRIX_ROWS:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    getVectorArrayCtr_abi_cxx11_(&local_80,local_58,ptVar3[iVar6].m_n_cols,ptVar3[iVar6].m_n_rows);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    goto LAB_009f6dcd;
  case STRUCT:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,0,ptVar3[iVar6].m_n_rows);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,2,ptVar3[iVar6].m_n_rows);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) break;
    goto LAB_009f6bf0;
  case ARRAY_SCALAR:
  case UNSIZED_ARRAY_SCALAR:
    pIVar4 = (InitializerListTest *)0x0;
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    getVectorValues_abi_cxx11_(&local_80,pIVar4,0,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    goto LAB_009f6dcd;
  case ARRAY_VECTOR_CTR:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    getVectorArrayCtr_abi_cxx11_(&local_80,local_58,4,ptVar3[iVar6].m_n_rows);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    goto LAB_009f6dcd;
  case ARRAY_VECTOR_LIST:
  case UNSIZED_ARRAY_VECTOR:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    getVectorArrayList_abi_cxx11_(&local_80,local_58,4,ptVar3[iVar6].m_n_rows);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
LAB_009f6dcd:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    break;
  case ARRAY_MATRIX_CTR:
    if (ptVar3[iVar6].m_n_rows - 5 < 0xfffffffc || ptVar3[iVar6].m_n_cols - 5 < 0xfffffffc) {
      __s = (char *)0x0;
    }
    else {
      __s = Utils::getTypeName::float_lut[ptVar3[iVar6].m_n_cols - 1][ptVar3[iVar6].m_n_rows - 1];
    }
    local_60 = paVar1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,__s,(allocator<char> *)local_50);
    iVar8 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x1c03d98);
    do {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      pIVar4 = (InitializerListTest *)0x1b986ab;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (ptVar3[iVar6].m_n_cols != 0) {
        column = 0;
        do {
          getVectorValues_abi_cxx11_((string *)local_50,pIVar4,column,ptVar3[iVar6].m_n_rows);
          pIVar4 = (InitializerListTest *)local_50._0_8_;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_50._0_8_);
          if ((InitializerListTest *)local_50._0_8_ != (InitializerListTest *)(local_50 + 0x10)) {
            pIVar4 = (InitializerListTest *)(local_50._16_8_ + 1);
            operator_delete((void *)local_50._0_8_,(ulong)pIVar4);
          }
          column = column + 1;
          if (column < ptVar3[iVar6].m_n_cols) {
            pIVar4 = (InitializerListTest *)0x1ad75d0;
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        } while (column < ptVar3[iVar6].m_n_cols);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (iVar8 != 3) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 4);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_009f7724:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_MATRIX:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    iVar8 = 4;
    local_60 = paVar1;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorArrayList_abi_cxx11_
                (&local_80,local_58,ptVar3[iVar6].m_n_cols,ptVar3[iVar6].m_n_rows);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (iVar8 != 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    break;
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    iVar8 = 4;
    local_60 = paVar1;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,0,ptVar3[iVar6].m_n_rows);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,2,ptVar3[iVar6].m_n_rows);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (iVar8 != 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    break;
  case NESTED_STRUCT_CTR:
    pIVar4 = (InitializerListTest *)0x0;
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1ad7585);
    getVectorConstructor_abi_cxx11_(&local_80,pIVar4,0,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    paVar1 = &local_80.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pIVar4 = (InitializerListTest *)0x1ad75d0;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_80,pIVar4,2,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pIVar4 = (InitializerListTest *)0x1b31a0f;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_80,pIVar4,3,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    break;
  case NESTED_STRUCT_LIST:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1ad75ac);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,0,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    paVar1 = &local_80.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,2,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,3,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar1) break;
LAB_009f6bf0:
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,0,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    paVar2 = &local_80.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar6 = 3;
    local_60 = paVar1;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,2,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,3,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (iVar6 != 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    pIVar4 = (InitializerListTest *)0x0;
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    getVectorConstructor_abi_cxx11_(&local_80,pIVar4,0,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    paVar1 = &local_80.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar6 = 3;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,2,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      pIVar4 = (InitializerListTest *)0x1ad75d0;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_80,pIVar4,3,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (iVar6 != 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    paVar2 = &local_80.field_2;
    iVar6 = 4;
    local_60 = paVar1;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,0,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,1,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,2,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (iVar6 != 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c261bd);
    paVar2 = &local_80.field_2;
    bVar7 = true;
    local_60 = paVar1;
    while( true ) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pIVar4 = (InitializerListTest *)0x1ad759c;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_80,pIVar4,0,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = " , ";
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_80,(InitializerListTest *)pcVar5,1,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      pIVar4 = (InitializerListTest *)0x1b31a0f;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_80,pIVar4,2,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,0,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,1,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_80,local_58,2,4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (!bVar7) break;
      bVar7 = false;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1c03d98);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,0,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    paVar1 = &local_80.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,1,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,2,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_80,local_58,3,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    goto LAB_009f7252;
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1ad75d3);
    pIVar4 = (InitializerListTest *)0x1ad75e0;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_80,pIVar4,0,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    paVar1 = &local_80.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = " , vec4[2]( ";
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_80,(InitializerListTest *)pcVar5,1,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = " , ";
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_80,(InitializerListTest *)pcVar5,2,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar5 = " , ";
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_80,(InitializerListTest *)pcVar5,3,4);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
LAB_009f7252:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3721);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getInitialization()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	std::string initialization;

	switch (test_case.m_initializer)
	{
	case VECTOR:
		initialization.append(getVectorInitializer(0 /*column*/, test_case.m_n_rows));

		break;

	case MATRIX:
		initialization = "{ ";
		initialization.append(getVectorArrayList(test_case.m_n_cols, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case MATRIX_ROWS:
	{
		initialization = "{ ";
		initialization.append(getVectorArrayCtr(test_case.m_n_cols, test_case.m_n_rows));
		initialization.append(" }");
	}
	break;

	case STRUCT:
		initialization = "{ ";
		initialization.append(getVectorInitializer(0 /* column */, test_case.m_n_rows));
		initialization.append(", ");
		initialization.append(getVectorInitializer(2 /* column */, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case ARRAY_SCALAR:
	case UNSIZED_ARRAY_SCALAR:
		initialization = "{ ";
		initialization.append(getVectorValues(0 /* column */, 4 /* size */));
		initialization.append(" }");

		break;

	case ARRAY_VECTOR_LIST:
	case UNSIZED_ARRAY_VECTOR:
		initialization = "{ ";
		initialization.append(getVectorArrayList(4 /* columns */, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case ARRAY_VECTOR_CTR:
		initialization = "{ ";
		initialization.append(getVectorArrayCtr(4 /* columns */, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case ARRAY_MATRIX_LIST:
	case UNSIZED_ARRAY_MATRIX:
		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorArrayList(test_case.m_n_cols, test_case.m_n_rows));
			initialization.append(" }");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");

		break;

	case ARRAY_MATRIX_CTR:
	{
		const std::string& type_name = Utils::getTypeName(Utils::FLOAT, test_case.m_n_cols, test_case.m_n_rows);

		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append(type_name);
			initialization.append("(");
			for (GLuint col = 0; col < test_case.m_n_cols; ++col)
			{
				initialization.append(getVectorValues(col, test_case.m_n_rows));

				if (col + 1 < test_case.m_n_cols)
				{
					initialization.append(", ");
				}
			}
			initialization.append(")");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");
	}
	break;

	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorInitializer(0 /* column */, test_case.m_n_rows));
			initialization.append(", ");
			initialization.append(getVectorInitializer(2 /* column */, test_case.m_n_rows));
			initialization.append(" }");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");

		break;

	case NESTED_STRUCT_CTR:
		initialization = "StructureWithStructure(BasicStructure(";
		initialization.append(getVectorConstructor(0 /* column */, 4));
		initialization.append(", ");
		initialization.append(getVectorConstructor(2 /* column */, 4));
		initialization.append("), ");
		initialization.append(getVectorConstructor(3 /* column */, 4));
		initialization.append(")");

		break;

	case NESTED_STRUCT_LIST:
		initialization = "{ { ";
		initialization.append(getVectorInitializer(0 /* column */, 4));
		initialization.append(", ");
		initialization.append(getVectorInitializer(2 /* column */, 4));
		initialization.append(" }, ");
		initialization.append(getVectorInitializer(3 /* column */, 4));
		initialization.append(" }");

		break;

	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
		initialization = "{ ";
		initialization.append(getVectorInitializer(0 /* column */, 4));
		initialization.append(", { ");

		for (GLuint i = 0; i < 3; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorInitializer(2 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorInitializer(3 /* column */, 4));
			initialization.append(" }");

			if (i + 1 < 3)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" } }");

		break;

	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		initialization = "{ ";
		initialization.append(getVectorConstructor(0 /* column */, 4));
		initialization.append(", { ");

		for (GLuint i = 0; i < 3; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorInitializer(2 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorConstructor(3 /* column */, 4));
			initialization.append(" }");

			if (i + 1 < 3)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" } }");

		break;

	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append("{ { ");

			initialization.append(getVectorInitializer(0 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorInitializer(1 /* column */, 4));

			initialization.append(" }, ");

			initialization.append(getVectorInitializer(2 /* column */, 4));

			initialization.append(" }");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");

		break;

	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		initialization = "{\n";

		for (GLuint i = 0; i < 2; ++i)
		{
			initialization.append("StructureWithStructure(\n");
			initialization.append("BasicStructure(");

			initialization.append(getVectorConstructor(0 /* column */, 4));
			initialization.append(" , ");
			initialization.append(getVectorConstructor(1 /* column */, 4));

			initialization.append("), ");

			initialization.append(getVectorConstructor(2 /* column */, 4));

			initialization.append(")");

			initialization.append(" , ");

			initialization.append("{ { ");

			initialization.append(getVectorInitializer(0 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorInitializer(1 /* column */, 4));

			initialization.append(" }, ");

			initialization.append(getVectorInitializer(2 /* column */, 4));

			initialization.append(" }");

			if (i + 1 < 2)
			{
				initialization.append(" , ");
			}
		}

		initialization.append(" }");

		break;

	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
		initialization = "{ ";
		initialization.append("{ ");
		initialization.append(getVectorInitializer(0 /* column */, 4));
		initialization.append(", ");
		initialization.append("{ ");
		initialization.append(getVectorInitializer(1 /* column */, 4));
		initialization.append(", ");
		initialization.append(getVectorInitializer(2 /* column */, 4));
		initialization.append(" }");
		initialization.append(" }");
		initialization.append(", ");
		initialization.append(getVectorInitializer(3 /* column */, 4));
		initialization.append(" }");

		break;

	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		initialization = "StructureWithStructureWithArray(";
		initialization.append("StructureWithArray(");
		initialization.append(getVectorConstructor(0 /* column */, 4));
		initialization.append(" , vec4[2]( ");
		initialization.append(getVectorConstructor(1 /* column */, 4));
		initialization.append(" , ");
		initialization.append(getVectorConstructor(2 /* column */, 4));
		initialization.append(" )");
		initialization.append(")");
		initialization.append(" , ");
		initialization.append(getVectorConstructor(3 /* column */, 4));
		initialization.append(")");

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return initialization;
}